

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_NtkCiFonNum(Cba_Ntk_t *p)

{
  int iVar1;
  undefined4 local_1c;
  int Count;
  int iObj;
  int i;
  Cba_Ntk_t *p_local;
  
  local_1c = Cba_NtkPiNum(p);
  for (Count = 0; iVar1 = Cba_NtkBoxSeqNum(p), Count < iVar1; Count = Count + 1) {
    iVar1 = Cba_NtkBoxSeq(p,Count);
    iVar1 = Cba_ObjFonNum(p,iVar1);
    local_1c = iVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

int Cba_NtkCiFonNum( Cba_Ntk_t * p )
{
    int i, iObj, Count = Cba_NtkPiNum(p);
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Count += Cba_ObjFonNum(p, iObj);
    return Count;  
}